

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unames.cpp
# Opt level: O3

void uprv_getCharNameCharacters_63(USetAdder *sa)

{
  UBool UVar1;
  uint uVar2;
  long lVar3;
  uint length;
  ulong uVar4;
  UErrorCode errorCode;
  char cs [256];
  UChar us [256];
  UErrorCode local_32c;
  char local_328 [256];
  UChar local_228 [260];
  
  local_32c = U_ZERO_ERROR;
  UVar1 = icu_63::calcNameSetsLengths(&local_32c);
  if (UVar1 != '\0') {
    length = 0;
    uVar2 = 0;
    do {
      if ((*(uint *)(icu_63::gNameSet + (ulong)(uVar2 >> 5) * 4) >> (uVar2 & 0x1f) & 1) != 0) {
        lVar3 = (long)(int)length;
        length = length + 1;
        local_328[lVar3] = (char)uVar2;
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 != 0x100);
    u_charsToUChars_63(local_328,local_228,length);
    if (0 < (int)length) {
      uVar4 = 0;
      do {
        if ((local_228[uVar4] != L'\0') || (local_328[uVar4] == '\0')) {
          (*(code *)sa->add)(sa->set);
        }
        uVar4 = uVar4 + 1;
      } while (length != uVar4);
    }
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
uprv_getCharNameCharacters(const USetAdder *sa) {
    charSetToUSet(gNameSet, sa);
}